

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall
QPDFJob::processInputSource
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
          shared_ptr<InputSource> *is,char *password,bool used_for_input)

{
  _Bind<std::_Mem_fn<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*)>_(std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>)>
  local_60;
  _Any_data local_40;
  code *local_30;
  
  local_60._M_f.super__Mem_fn_base<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*),_true>
  ._M_pmf = (offset_in_QPDF_to_subr)QPDF::processInputSource;
  local_60._M_f.super__Mem_fn_base<void_(QPDF::*)(std::shared_ptr<InputSource>,_const_char_*),_true>
  ._8_8_ = 0;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
  super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
  super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_60._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
      .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
      super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_bound_args.
       super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
       .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
       super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
           = (local_60._M_bound_args.
              super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
              .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
              super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_bound_args.
       super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
       .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
       super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
           = (local_60._M_bound_args.
              super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
              .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
              super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
    }
  }
  std::function<void(QPDF*,char_const*)>::
  function<std::_Bind<std::_Mem_fn<void(QPDF::*)(std::shared_ptr<InputSource>,char_const*)>(std::_Placeholder<1>,std::shared_ptr<InputSource>,std::_Placeholder<2>)>&,void>
            ((function<void(QPDF*,char_const*)> *)local_40._M_pod_data,&local_60);
  doProcess(this,pdf,(function<void_(QPDF_*,_const_char_*)> *)&local_40,password,false,
            used_for_input,false);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_60._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
      .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
      super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60._M_bound_args.
               super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>
               .super__Tuple_impl<1UL,_std::shared_ptr<InputSource>,_std::_Placeholder<2>_>.
               super__Head_base<1UL,_std::shared_ptr<InputSource>,_false>._M_head_impl.
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFJob::processInputSource(
    std::unique_ptr<QPDF>& pdf,
    std::shared_ptr<InputSource> is,
    char const* password,
    bool used_for_input)
{
    auto f1 = std::mem_fn(&QPDF::processInputSource);
    auto fn = std::bind(f1, std::placeholders::_1, is, std::placeholders::_2);
    doProcess(pdf, fn, password, false, used_for_input, false);
}